

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::StringPutcMethod::StringPutcMethod(StringPutcMethod *this,Builtins *builtins)

{
  initializer_list<const_slang::ast::Type_*> __l;
  iterator ppTVar1;
  SimpleSystemSubroutine *this_00;
  long in_RSI;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *in_RDI;
  undefined2 uVar2;
  Type *in_stack_ffffffffffffffa0;
  allocator_type *in_stack_ffffffffffffffa8;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
  *in_stack_ffffffffffffffb0;
  
  ppTVar1 = (iterator)(in_RSI + 0x210);
  this_00 = (SimpleSystemSubroutine *)(in_RSI + 0x2c0);
  uVar2 = (undefined2)((ulong)&stack0xffffffffffffffb7 >> 0x30);
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0x138ce93);
  __l._M_len = (size_type)this_00;
  __l._M_array = ppTVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (in_stack_ffffffffffffffb0,__l,in_stack_ffffffffffffffa8);
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (this_00,(KnownSystemName)((ulong)ppTVar1 >> 0x20),(SubroutineKind)ppTVar1,
             (size_t)in_stack_ffffffffffffffb0,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,SUB21((ushort)uVar2 >> 8,0),
             SUB21(uVar2,0));
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector(in_RDI);
  std::allocator<const_slang::ast::Type_*>::~allocator
            ((allocator<const_slang::ast::Type_*> *)&stack0xffffffffffffffb7);
  (in_RDI->super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__StringPutcMethod_01a2d820;
  return;
}

Assistant:

explicit StringPutcMethod(const Builtins& builtins) :
        SimpleSystemSubroutine(KnownSystemName::Putc, SubroutineKind::Function, 2,
                               {&builtins.intType, &builtins.byteType}, builtins.voidType, true,
                               /* isFirstArgLValue */ true) {}